

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O1

ZyanStatus ZyanVectorDeleteRange(ZyanVector *vector,ZyanUSize index,ZyanUSize count)

{
  ulong uVar1;
  void *pvVar2;
  ZyanStatus ZVar3;
  long lVar4;
  ZyanUSize i;
  ZyanUSize ZVar5;
  ZyanUSize ZVar6;
  
  ZVar3 = 0x80100004;
  if (count != 0 && vector != (ZyanVector *)0x0) {
    uVar1 = count + index;
    ZVar3 = 0x80100008;
    if (uVar1 <= vector->size) {
      ZVar5 = index;
      ZVar6 = count;
      if (index < uVar1 && vector->destructor != (ZyanMemberProcedure)0x0) {
        do {
          (*vector->destructor)((void *)(vector->element_size * ZVar5 + (long)vector->data));
          ZVar6 = ZVar6 - 1;
          ZVar5 = ZVar5 + 1;
        } while (ZVar6 != 0);
      }
      lVar4 = vector->size - uVar1;
      if (uVar1 <= vector->size && lVar4 != 0) {
        ZVar5 = vector->element_size;
        if (ZVar5 == 0) {
          __assert_fail("vector->element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x85,"ZyanStatus ZyanVectorShiftLeft(ZyanVector *, ZyanUSize, ZyanUSize)");
        }
        pvVar2 = vector->data;
        if (pvVar2 == (void *)0x0) {
          __assert_fail("vector->data",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                        ,0x86,"ZyanStatus ZyanVectorShiftLeft(ZyanVector *, ZyanUSize, ZyanUSize)");
        }
        memmove((void *)(index * ZVar5 + (long)pvVar2),(void *)(uVar1 * ZVar5 + (long)pvVar2),
                lVar4 * ZVar5);
      }
      ZVar5 = vector->size - count;
      vector->size = ZVar5;
      ZVar3 = 0x100000;
      if (((ulong)vector->shrink_threshold != 0) &&
         (vector->shrink_threshold * ZVar5 < vector->capacity)) {
        lVar4 = ZVar5 * vector->growth_factor;
        ZVar3 = ZyanVectorReallocate(vector,lVar4 + (ulong)(lVar4 == 0));
        return ZVar3;
      }
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZyanVectorDeleteRange(ZyanVector* vector, ZyanUSize index, ZyanUSize count)
{
    if (!vector || !count)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (index + count > vector->size)
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (vector->destructor)
    {
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            vector->destructor(ZYCORE_VECTOR_OFFSET(vector, i));
        }
    }

    if (index + count < vector->size)
    {
        ZYAN_CHECK(ZyanVectorShiftLeft(vector, index, count));
    }

    vector->size -= count;
    if (ZYCORE_VECTOR_SHOULD_SHRINK(vector->size, vector->capacity, vector->shrink_threshold))
    {
        return ZyanVectorReallocate(vector,
            ZYAN_MAX(1, (ZyanUSize)(vector->size * vector->growth_factor)));
    }

    return ZYAN_STATUS_SUCCESS;
}